

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosStream.cpp
# Opt level: O1

void __thiscall adiosStream::Close(adiosStream *this)

{
  int myRank;
  int totalRanks;
  int local_10;
  undefined1 local_c [4];
  
  MPI_Comm_rank(this->comm,&local_10);
  MPI_Comm_size(this->comm,local_c);
  if ((this->hasIOTimer == true) && (local_10 == 0)) {
    fclose((FILE *)this->perfLogFP);
  }
  adios2::Engine::Close((int)this + 0x30);
  return;
}

Assistant:

void adiosStream::Close()
{
    int myRank, totalRanks;
    MPI_Comm_rank(comm, &myRank);
    MPI_Comm_size(comm, &totalRanks);
    if (hasIOTimer)
    {
        if (myRank == 0)
        {
            fclose(perfLogFP);
        }
    }
    engine.Close();
}